

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigurationGroup.cpp
# Opt level: O1

bool __thiscall
Corrade::Utility::ConfigurationGroup::setValueInternal
          (ConfigurationGroup *this,string *key,string *value,uint index,
          ConfigurationValueFlags param_4)

{
  byte *pbVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  pointer pVVar4;
  size_t __n;
  pointer pcVar5;
  int iVar6;
  long lVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  ostream *poVar9;
  bool bVar10;
  uint uVar11;
  uint uVar12;
  Value *v;
  pointer pVVar13;
  bool bVar14;
  bool bVar15;
  vector<Corrade::Utility::ConfigurationGroup::Value,_std::allocator<Corrade::Utility::ConfigurationGroup::Value>_>
  *__range2;
  Value local_70;
  
  if (key->_M_string_length == 0) {
    poVar9 = Error::defaultOutput();
    Error::Error((Error *)&local_70,poVar9,(Flags)0x0);
    Debug::operator<<((Debug *)&local_70,"Utility::ConfigurationGroup::setValue(): empty key");
  }
  else {
    uVar11 = 0;
    lVar7 = std::__cxx11::string::find_first_of((char *)key,0x1313d0,0);
    if (lVar7 == -1) {
      pVVar13 = (this->_values).
                super__Vector_base<Corrade::Utility::ConfigurationGroup::Value,_std::allocator<Corrade::Utility::ConfigurationGroup::Value>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pVVar4 = (this->_values).
               super__Vector_base<Corrade::Utility::ConfigurationGroup::Value,_std::allocator<Corrade::Utility::ConfigurationGroup::Value>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      bVar14 = pVVar13 == pVVar4;
      if (!bVar14) {
        uVar11 = 0;
        do {
          __n = (pVVar13->key)._M_string_length;
          bVar10 = true;
          if (__n == key->_M_string_length) {
            if (__n != 0) {
              iVar6 = bcmp((pVVar13->key)._M_dataplus._M_p,(key->_M_dataplus)._M_p,__n);
              if (iVar6 != 0) goto LAB_0011997e;
            }
            uVar12 = uVar11 + 1;
            bVar15 = uVar11 == index;
            uVar11 = uVar12;
            if (bVar15) {
              std::__cxx11::string::operator=((string *)&pVVar13->value,(string *)value);
              if (this->_configuration != (Configuration *)0x0) {
                pbVar1 = (byte *)((long)&(this->_configuration->_flags)._value + 2);
                *pbVar1 = *pbVar1 | 8;
              }
              bVar10 = false;
            }
          }
LAB_0011997e:
          if (!bVar10) break;
          pVVar13 = pVVar13 + 1;
          bVar14 = pVVar13 == pVVar4;
        } while (!bVar14);
      }
      bVar10 = true;
      if (bVar14) {
        if (uVar11 < index) {
          bVar10 = false;
        }
        else {
          paVar2 = &local_70.key.field_2;
          pcVar5 = (key->_M_dataplus)._M_p;
          local_70.key._M_dataplus._M_p = (pointer)paVar2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_70,pcVar5,pcVar5 + key->_M_string_length);
          paVar3 = &local_70.value.field_2;
          local_70.value._M_dataplus._M_p = (value->_M_dataplus)._M_p;
          paVar8 = &value->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70.value._M_dataplus._M_p == paVar8) {
            local_70.value.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
            local_70.value.field_2._8_8_ = *(undefined8 *)((long)&value->field_2 + 8);
            local_70.value._M_dataplus._M_p = (pointer)paVar3;
          }
          else {
            local_70.value.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
          }
          local_70.value._M_string_length = value->_M_string_length;
          (value->_M_dataplus)._M_p = (pointer)paVar8;
          value->_M_string_length = 0;
          (value->field_2)._M_local_buf[0] = '\0';
          std::
          vector<Corrade::Utility::ConfigurationGroup::Value,_std::allocator<Corrade::Utility::ConfigurationGroup::Value>_>
          ::emplace_back<Corrade::Utility::ConfigurationGroup::Value>(&this->_values,&local_70);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70.value._M_dataplus._M_p != paVar3) {
            operator_delete(local_70.value._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70.key._M_dataplus._M_p != paVar2) {
            operator_delete(local_70.key._M_dataplus._M_p);
          }
          if (this->_configuration != (Configuration *)0x0) {
            pbVar1 = (byte *)((long)&(this->_configuration->_flags)._value + 2);
            *pbVar1 = *pbVar1 | 8;
          }
        }
      }
      return bVar10;
    }
    poVar9 = Error::defaultOutput();
    Error::Error((Error *)&local_70,poVar9,(Flags)0x0);
    Debug::operator<<((Debug *)&local_70,
                      "Utility::ConfigurationGroup::setValue(): disallowed character in key");
  }
  Error::~Error((Error *)&local_70);
  abort();
}

Assistant:

bool ConfigurationGroup::setValueInternal(const std::string& key, std::string value, const unsigned int index, ConfigurationValueFlags) {
    CORRADE_ASSERT(!key.empty(), "Utility::ConfigurationGroup::setValue(): empty key", false);
    CORRADE_ASSERT(key.find_first_of("\n=") == std::string::npos,
        "Utility::ConfigurationGroup::setValue(): disallowed character in key", false);

    unsigned int foundIndex = 0;
    for(Value& v: _values) {
        if(v.key == key && foundIndex++ == index) {
            v.value = std::move(value);
            if(_configuration) _configuration->_flags |= Configuration::InternalFlag::Changed;
            return true;
        }
    }

    /* Wanted to set value with index much larger than what we have */
    if(index > foundIndex) return false;

    /* No value with that name was found, add new */
    _values.push_back({key, std::move(value)});

    if(_configuration) _configuration->_flags |= Configuration::InternalFlag::Changed;
    return true;
}